

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O0

void __thiscall aeron::ClientConductor::releaseCounter(ClientConductor *this,int64_t registrationId)

{
  bool bVar1;
  const_iterator in_RDI;
  __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
  __last;
  ClientConductor *in_stack_00000060;
  __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
  it;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffff68;
  __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
  *in_stack_ffffffffffffff70;
  vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
  *this_00;
  __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
  in_stack_ffffffffffffff98;
  __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
  local_20 [4];
  
  verifyDriverIsActiveViaErrorHandler(in_stack_00000060);
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68
            );
  __last._M_current = in_RDI._M_current + 0x78;
  std::
  vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
  ::begin((vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
           *)in_stack_ffffffffffffff68);
  std::
  vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
  ::end((vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
         *)in_stack_ffffffffffffff68);
  local_20[0] = std::
                find_if<__gnu_cxx::__normal_iterator<aeron::ClientConductor::CounterStateDefn*,std::vector<aeron::ClientConductor::CounterStateDefn,std::allocator<aeron::ClientConductor::CounterStateDefn>>>,aeron::ClientConductor::releaseCounter(long)::__0>
                          (in_stack_ffffffffffffff98,__last,in_RDI._M_current);
  std::
  vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
  ::end((vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
         *)in_stack_ffffffffffffff68);
  bVar1 = __gnu_cxx::operator!=
                    (in_stack_ffffffffffffff70,
                     (__normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
                      *)in_stack_ffffffffffffff68);
  if (bVar1) {
    this_00 = (vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
               *)in_RDI._M_current[2].m_registrationId;
    __gnu_cxx::
    __normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
    ::operator*(local_20);
    DriverProxy::removeCounter((DriverProxy *)__last._M_current,(int64_t)in_RDI._M_current);
    __gnu_cxx::
    __normal_iterator<aeron::ClientConductor::CounterStateDefn_const*,std::vector<aeron::ClientConductor::CounterStateDefn,std::allocator<aeron::ClientConductor::CounterStateDefn>>>
    ::__normal_iterator<aeron::ClientConductor::CounterStateDefn*>
              ((__normal_iterator<const_aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
                *)&in_RDI._M_current[1].m_status,
               (__normal_iterator<aeron::ClientConductor::CounterStateDefn_*,_std::vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>_>
                *)in_stack_ffffffffffffff68);
    std::
    vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
    ::erase(this_00,in_RDI);
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1c6996);
  return;
}

Assistant:

void ClientConductor::releaseCounter(std::int64_t registrationId)
{
    verifyDriverIsActiveViaErrorHandler();

    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto it = std::find_if(
        m_counters.begin(),
        m_counters.end(),
        [registrationId](const CounterStateDefn &entry)
        {
            return registrationId == entry.m_registrationId;
        });

    if (it != m_counters.end())
    {
        m_driverProxy.removeCounter((*it).m_registrationId);

        m_counters.erase(it);
    }
}